

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
MatchExpr<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_EigenIsApprox<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
::streamReconstructedExpression
          (MatchExpr<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_EigenIsApprox<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
           *this,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  Matrix<float,__1,_1,_0,__1,_1> *value;
  string matcherAsString;
  char local_59;
  string local_58;
  type local_38;
  
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
            (&local_58,(MatcherUntypedBase *)&this->m_matcher);
  StringMaker<Eigen::Matrix<float,-1,1,0,-1,1>,void>::convert<Eigen::Matrix<float,_1,1,0,_1,1>>
            (&local_38,(StringMaker<Eigen::Matrix<float,_1,1,0,_1,1>,void> *)this->m_arg,value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  local_59 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58._M_string_length == DAT_0019f2e0) {
    if (local_58._M_string_length != 0) {
      iVar1 = bcmp(local_58._M_dataplus._M_p,Detail::unprintableString_abi_cxx11_,
                   local_58._M_string_length);
      if (iVar1 != 0) goto LAB_001182ea;
    }
    operator<<((ostream *)os,&this->m_matcherString);
  }
  else {
LAB_001182ea:
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_58._M_dataplus._M_p,local_58._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }